

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LoopFusionPass::ProcessFunction(LoopFusionPass *this,Function *function)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  IRContext *pIVar4;
  LoopDescriptor *this_00;
  reference loop_0_00;
  reference loop_1_00;
  __node_base_ptr *this_01;
  undefined1 local_2b8 [8];
  RegionRegisterLiveness reg_pressure;
  RegisterLiveness liveness;
  LoopFusion fusion;
  Loop *loop_1;
  iterator __end3;
  iterator __begin3;
  LoopDescriptor *__range3;
  Loop *loop_0;
  undefined1 local_e8 [8];
  iterator __end2;
  iterator __begin2;
  LoopDescriptor *__range2;
  bool modified;
  LoopDescriptor *ld;
  Function *function_local;
  LoopFusionPass *this_local;
  
  pIVar4 = Pass::context(&this->super_Pass);
  this_00 = IRContext::GetLoopDescriptor(pIVar4,function);
  bVar2 = LoopDescriptor::CreatePreHeaderBlocksIfMissing(this_00);
  LoopDescriptor::begin
            ((iterator *)
             ((long)&__end2.parent_iterators_.c.
                     super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18),this_00);
  LoopDescriptor::end((iterator *)local_e8,this_00);
  while (bVar3 = PostOrderTreeDFIterator<spvtools::opt::Loop>::operator!=
                           ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
                            ((long)&__end2.parent_iterators_.c.
                                    super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                                    ._M_impl.super__Deque_impl_data._M_finish + 0x18),
                            (PostOrderTreeDFIterator<spvtools::opt::Loop> *)local_e8), bVar3) {
    loop_0_00 = PostOrderTreeDFIterator<spvtools::opt::Loop>::operator*
                          ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
                           ((long)&__end2.parent_iterators_.c.
                                   super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                                   ._M_impl.super__Deque_impl_data._M_finish + 0x18));
    LoopDescriptor::begin
              ((iterator *)
               ((long)&__end3.parent_iterators_.c.
                       super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish + 0x18),this_00);
    LoopDescriptor::end((iterator *)&loop_1,this_00);
    while (bVar3 = PostOrderTreeDFIterator<spvtools::opt::Loop>::operator!=
                             ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
                              ((long)&__end3.parent_iterators_.c.
                                      super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish + 0x18),
                              (PostOrderTreeDFIterator<spvtools::opt::Loop> *)&loop_1), bVar3) {
      loop_1_00 = PostOrderTreeDFIterator<spvtools::opt::Loop>::operator*
                            ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
                             ((long)&__end3.parent_iterators_.c.
                                     super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
      pIVar4 = Pass::context(&this->super_Pass);
      LoopFusion::LoopFusion
                ((LoopFusion *)&liveness.block_pressure_._M_h._M_single_bucket,pIVar4,loop_0_00,
                 loop_1_00);
      bVar3 = LoopFusion::AreCompatible
                        ((LoopFusion *)&liveness.block_pressure_._M_h._M_single_bucket);
      if ((bVar3) &&
         (bVar3 = LoopFusion::IsLegal((LoopFusion *)&liveness.block_pressure_._M_h._M_single_bucket)
         , bVar3)) {
        pIVar4 = Pass::context(&this->super_Pass);
        RegisterLiveness::RegisterLiveness
                  ((RegisterLiveness *)
                   &reg_pressure.registers_classes_.
                    super__Vector_base<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pIVar4,function);
        memset((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                *)local_2b8,0,0x38);
        std::
        unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
        ::unordered_set((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                         *)local_2b8);
        this_01 = &reg_pressure.live_in_._M_h._M_single_bucket;
        memset(this_01,0,0x38);
        std::
        unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
        ::unordered_set((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                         *)this_01);
        reg_pressure.live_out_._M_h._M_single_bucket = (__node_base_ptr)0x0;
        memset(&reg_pressure.used_registers_,0,0x18);
        std::
        vector<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_>_>
        ::vector((vector<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_>_>
                  *)&reg_pressure.used_registers_);
        RegisterLiveness::SimulateFusion
                  ((RegisterLiveness *)
                   &reg_pressure.registers_classes_.
                    super__Vector_base<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,loop_0_00,loop_1_00,
                   (RegionRegisterLiveness *)local_2b8);
        cVar1 = reg_pressure.live_out_._M_h._M_single_bucket <=
                (__node_base_ptr)this->max_registers_per_loop_;
        if ((bool)cVar1) {
          LoopFusion::Fuse((LoopFusion *)&liveness.block_pressure_._M_h._M_single_bucket);
          ProcessFunction(this,function);
          this_local._7_1_ = 1;
        }
        RegisterLiveness::RegionRegisterLiveness::~RegionRegisterLiveness
                  ((RegionRegisterLiveness *)local_2b8);
        RegisterLiveness::~RegisterLiveness
                  ((RegisterLiveness *)
                   &reg_pressure.registers_classes_.
                    super__Vector_base<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((bool)cVar1) goto LAB_004006b7;
      }
      PostOrderTreeDFIterator<spvtools::opt::Loop>::operator++
                ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
                 ((long)&__end3.parent_iterators_.c.
                         super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish + 0x18));
    }
    cVar1 = '\x04';
LAB_004006b7:
    PostOrderTreeDFIterator<spvtools::opt::Loop>::~PostOrderTreeDFIterator
              ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)&loop_1);
    PostOrderTreeDFIterator<spvtools::opt::Loop>::~PostOrderTreeDFIterator
              ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
               ((long)&__end3.parent_iterators_.c.
                       super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish + 0x18));
    if (cVar1 != '\x04') goto LAB_004006ef;
    PostOrderTreeDFIterator<spvtools::opt::Loop>::operator++
              ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
               ((long)&__end2.parent_iterators_.c.
                       super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  }
  cVar1 = '\x02';
LAB_004006ef:
  PostOrderTreeDFIterator<spvtools::opt::Loop>::~PostOrderTreeDFIterator
            ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)local_e8);
  PostOrderTreeDFIterator<spvtools::opt::Loop>::~PostOrderTreeDFIterator
            ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
             ((long)&__end2.parent_iterators_.c.
                     super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  if (cVar1 != '\x01') {
    this_local._7_1_ = bVar2;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool LoopFusionPass::ProcessFunction(Function* function) {
  LoopDescriptor& ld = *context()->GetLoopDescriptor(function);

  // If a loop doesn't have a preheader needs then it needs to be created. Make
  // sure to return Status::SuccessWithChange in that case.
  auto modified = ld.CreatePreHeaderBlocksIfMissing();

  // TODO(tremmelg): Could the only loop that |loop| could possibly be fused be
  // picked out so don't have to check every loop
  for (auto& loop_0 : ld) {
    for (auto& loop_1 : ld) {
      LoopFusion fusion(context(), &loop_0, &loop_1);

      if (fusion.AreCompatible() && fusion.IsLegal()) {
        RegisterLiveness liveness(context(), function);
        RegisterLiveness::RegionRegisterLiveness reg_pressure{};
        liveness.SimulateFusion(loop_0, loop_1, &reg_pressure);

        if (reg_pressure.used_registers_ <= max_registers_per_loop_) {
          fusion.Fuse();
          // Recurse, as the current iterators will have been invalidated.
          ProcessFunction(function);
          return true;
        }
      }
    }
  }

  return modified;
}